

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::
AddTestPattern(ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>
               *this,char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<solitaire::colliders::CollidedCardsInHandData> *meta_factory,
              CodeLocation *code_location)

{
  TestInfo *this_00;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>
  sStack_68;
  CodeLocation local_58;
  
  this_00 = (TestInfo *)operator_new(0x70);
  CodeLocation::CodeLocation(&local_58,code_location);
  TestInfo::TestInfo(this_00,test_suite_name,test_base_name,meta_factory,&local_58);
  std::
  __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo,void>
            ((__shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo,(__gnu_cxx::_Lock_policy)2>
              *)&sStack_68,this_00);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>>>
  ::
  emplace_back<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>>
            ((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo>>>
              *)&this->tests_,&sStack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_68.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::TableauPileColliderCollideWithCardsInHandTests>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }